

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::GetDirectBufferPointer
          (CodedInputStream *this,void **data,int *size)

{
  bool bVar1;
  int iVar2;
  int *size_local;
  void **data_local;
  CodedInputStream *this_local;
  
  iVar2 = BufferSize(this);
  if ((iVar2 == 0) && (bVar1 = Refresh(this), !bVar1)) {
    return false;
  }
  *data = this->buffer_;
  iVar2 = BufferSize(this);
  *size = iVar2;
  return true;
}

Assistant:

bool CodedInputStream::GetDirectBufferPointer(const void** data, int* size) {
  if (BufferSize() == 0 && !Refresh()) return false;

  *data = buffer_;
  *size = BufferSize();
  return true;
}